

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_block.h
# Opt level: O2

void __thiscall
vector_block<unsigned_char_*,_1024U>::clear(vector_block<unsigned_char_*,_1024U> *this)

{
  pointer pppuVar1;
  pointer pppuVar2;
  size_t i;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    pppuVar1 = (this->_index_block).
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_start;
    pppuVar2 = (this->_index_block).
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if ((ulong)((long)pppuVar2 - (long)pppuVar1 >> 3) <= uVar3) break;
    free(pppuVar1[uVar3]);
    uVar3 = uVar3 + 1;
  }
  if (pppuVar2 != pppuVar1) {
    (this->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
    _M_impl.super__Vector_impl_data._M_finish = pppuVar1;
  }
  this->_insertpos = (uchar **)0x0;
  this->_left_in_block = 0;
  return;
}

Assistant:

void clear()
	{
		for (size_t i=0; i < _index_block.size(); ++i) {
			free(_index_block[i]);
		}
		_index_block.clear();
		_insertpos=0;
		_left_in_block=0;
	}